

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_music.cpp
# Opt level: O2

MusInfo * I_RegisterSong(FileReader *reader,MidiDeviceSetting *device)

{
  byte bVar1;
  uint amount;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar5;
  undefined4 extraout_var_01;
  ushort *puVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  _func_int **pp_Var7;
  MusInfo *pMVar8;
  undefined4 extraout_var_04;
  MemoryArrayReader *pMVar9;
  BYTE *args;
  ulong uVar10;
  char *pcVar11;
  ushort *puVar12;
  DWORD id [8];
  DWORD subid;
  int local_98;
  uchar *local_88;
  uint local_80;
  undefined8 local_60;
  undefined8 uStack_58;
  
  if (nomusic == 0) {
    iVar2 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,id,0x20);
    if (CONCAT44(extraout_var,iVar2) == 0x20) {
      iVar2 = 1;
      iVar3 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[4])(reader,0xffffffffffffffe0,1)
      ;
      if (CONCAT44(extraout_var_00,iVar3) == 0) {
        if ((id[0] & 0xffffff) != 0x88b1f) {
LAB_00354ef7:
          iVar3 = MUSHeaderSearch((BYTE *)id,0x20);
          if (-1 < iVar3) {
            iVar2 = 4;
            goto LAB_00354f0c;
          }
          if (id[0] == 0x6468544d) goto LAB_00354f0c;
          iVar2 = 2;
          if (id[0] == 0x2d494d48) {
            if ((id[1] == 0x4944494d) && (id[2] == 0x474e4f53)) goto LAB_00354f0c;
          }
          else if (id[0] == 0x4d494d48) {
            if (id[1] == 0x50494449) goto LAB_00354f0c;
          }
          else {
            iVar2 = 3;
            if (id[0] == 0x4d524f46) {
              if (id[2] == 0x52494458) goto LAB_00354f0c;
            }
            else if (id[0] != 0x20544143) goto LAB_00355164;
            if (id[2] == 0x44494d58) {
LAB_00354f0c:
              pMVar8 = (MusInfo *)
                       (*(code *)(&DAT_005b0bb0 + *(int *)(&DAT_005b0bb0 + (ulong)(iVar2 - 1) * 4)))
                                 ();
              return pMVar8;
            }
          }
LAB_00355164:
          if (((id[1] == 0x41544144 && id[0] == 0x41574152) ||
              (id[1] == 0x4c504f57 && id[0] == 0x41524244)) ||
             ((id[1] & 0xff) == 0x42 && id[0] == 0x494c4441)) {
            pMVar9 = (MemoryArrayReader *)operator_new(0x20);
            if (device == (MidiDeviceSetting *)0x0) {
              args = "";
            }
            else {
              args = (BYTE *)(device->args).Chars;
            }
            OPLMUSSong::OPLMUSSong((OPLMUSSong *)pMVar9,reader,(char *)args);
LAB_003551e8:
            (*(((MemoryArrayReader *)reader)->super_FileReader).super_FileReaderBase.
              _vptr_FileReaderBase[1])(reader);
            reader = &pMVar9->super_FileReader;
            if (pMVar9 == (MemoryArrayReader *)0x0) {
              return (MusInfo *)0x0;
            }
          }
          else {
            pcVar11 = GME_CheckFormat(0);
            if ((pcVar11 == (char *)0x0) || (*pcVar11 == '\0')) {
              pMVar9 = (MemoryArrayReader *)MOD_OpenSong(reader);
            }
            else {
              pMVar9 = (MemoryArrayReader *)GME_OpenSong(reader,pcVar11);
            }
            if (pMVar9 != (MemoryArrayReader *)0x0) goto LAB_003551e8;
            if (id[0] == 0x46464952) {
              (*(((MemoryArrayReader *)reader)->super_FileReader).super_FileReaderBase.
                _vptr_FileReaderBase[4])(reader,8,1);
              iVar2 = (*(((MemoryArrayReader *)reader)->super_FileReader).super_FileReaderBase.
                        _vptr_FileReaderBase[2])(reader,&subid,4);
              pp_Var7 = (((MemoryArrayReader *)reader)->super_FileReader).super_FileReaderBase.
                        _vptr_FileReaderBase;
              if (CONCAT44(extraout_var_04,iVar2) != 4) {
                (*pp_Var7[1])(reader);
                return (MusInfo *)0x0;
              }
              (*pp_Var7[4])(reader,0xfffffffffffffff4,1);
              if (subid == 0x41444443) {
                pMVar9 = (MemoryArrayReader *)operator_new(0x18);
                CDDAFile::CDDAFile((CDDAFile *)pMVar9,reader);
                goto LAB_003551e8;
              }
            }
            if (((((MemoryArrayReader *)reader)->super_FileReader).Length < 0x400) &&
               (id[0] != 0x6468544d)) {
              pMVar9 = (MemoryArrayReader *)0x0;
              goto LAB_003551e8;
            }
            pMVar9 = (MemoryArrayReader *)operator_new(0x18);
            StreamSong::StreamSong((StreamSong *)pMVar9,reader);
            reader = (FileReader *)pMVar9;
          }
          iVar2 = (*(((MemoryArrayReader *)reader)->super_FileReader).super_FileReaderBase.
                    _vptr_FileReaderBase[10])(reader);
          if ((char)iVar2 != '\0') {
            return (MusInfo *)(MemoryArrayReader *)reader;
          }
          pp_Var7 = (((MemoryArrayReader *)reader)->super_FileReader).super_FileReaderBase.
                    _vptr_FileReaderBase;
          goto LAB_00354f68;
        }
        uVar10 = (ulong)(int)reader->Length;
        pvVar5 = operator_new__(uVar10);
        iVar3 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,pvVar5,uVar10);
        if (CONCAT44(extraout_var_01,iVar3) == uVar10) {
          (*(reader->super_FileReaderBase)._vptr_FileReaderBase[1])(reader);
          reader = (FileReader *)operator_new(0x40);
          MemoryArrayReader::MemoryArrayReader((MemoryArrayReader *)reader,(char *)0x0,0);
          puVar6 = (ushort *)((long)pvVar5 + 10);
          bVar1 = *(byte *)((long)pvVar5 + 3);
          if ((bVar1 & 4) != 0) {
            puVar6 = (ushort *)((long)puVar6 + (ulong)*puVar6 + 2);
          }
          puVar12 = (ushort *)((long)pvVar5 + (uVar10 - 8));
          if ((bVar1 & 8) != 0) {
            for (; (puVar6 < puVar12 && ((char)*puVar6 != '\0'));
                puVar6 = (ushort *)((long)puVar6 + 1)) {
            }
          }
          if ((bVar1 & 0x10) != 0) {
            for (; (puVar6 < puVar12 && ((char)*puVar6 != '\0'));
                puVar6 = (ushort *)((long)puVar6 + 1)) {
            }
          }
          pcVar11 = (char *)((ulong)(bVar1 & 2) + (long)puVar6);
          if (pcVar11 < (char *)((long)pvVar5 + (uVar10 - 9))) {
            amount = *(uint *)((long)pvVar5 + (uVar10 - 4));
            TArray<unsigned_char,_unsigned_char>::Resize(&((MemoryArrayReader *)reader)->buf,amount)
            ;
            local_98 = (int)puVar12 - (int)pcVar11;
            local_88 = (((MemoryArrayReader *)reader)->buf).Array;
            local_60 = 0;
            uStack_58 = 0;
            _subid = pcVar11;
            local_80 = amount;
            iVar3 = inflateInit2_(&subid,0xfffffffffffffff1,"1.2.11",0x70);
            if (iVar3 == 0) {
              iVar3 = inflate(&subid,4);
              iVar4 = inflateEnd(&subid);
              if (iVar4 == 0 && iVar3 == 1) {
                operator_delete__(pvVar5);
                (((MemoryArrayReader *)reader)->super_FileReader).Length =
                     (ulong)(((MemoryArrayReader *)reader)->buf).Count;
                iVar3 = (*(((MemoryArrayReader *)reader)->super_FileReader).super_FileReaderBase.
                          _vptr_FileReaderBase[2])(reader,id,0x20);
                if ((CONCAT44(extraout_var_02,iVar3) != 0x20) ||
                   (iVar3 = (*(((MemoryArrayReader *)reader)->super_FileReader).super_FileReaderBase
                              ._vptr_FileReaderBase[4])(reader,0xffffffffffffffe0,1),
                   CONCAT44(extraout_var_03,iVar3) != 0)) goto LAB_00354f62;
                goto LAB_00354ef7;
              }
            }
          }
        }
        operator_delete__(pvVar5);
      }
    }
  }
  else if (reader == (FileReader *)0x0) {
    return (MusInfo *)0x0;
  }
LAB_00354f62:
  pp_Var7 = (((MemoryArrayReader *)reader)->super_FileReader).super_FileReaderBase.
            _vptr_FileReaderBase;
LAB_00354f68:
  (*pp_Var7[1])(reader);
  return (MusInfo *)0x0;
}

Assistant:

MusInfo *I_RegisterSong (FileReader *reader, MidiDeviceSetting *device)
{
	MusInfo *info = NULL;
	const char *fmt;
	DWORD id[32/4];

	if (nomusic)
	{
		delete reader;
		return 0;
	}

	if(reader->Read(id, 32) != 32 || reader->Seek(-32, SEEK_CUR) != 0)
	{
		delete reader;
		return 0;
	}

    // Check for gzip compression. Some formats are expected to have players
    // that can handle it, so it simplifies things if we make all songs
    // gzippable.
	if ((id[0] & MAKE_ID(255, 255, 255, 0)) == GZIP_ID)
	{
		int len = reader->GetLength();
		BYTE *gzipped = new BYTE[len];
		if (reader->Read(gzipped, len) != len)
		{
			delete[] gzipped;
			delete reader;
			return NULL;
		}
		delete reader;

		MemoryArrayReader *memreader = new MemoryArrayReader(NULL, 0);
		if (!ungzip(gzipped, len, memreader->GetArray()))
		{
			delete[] gzipped;
			delete memreader;
			return 0;
		}
		delete[] gzipped;
		memreader->UpdateLength();

		if (memreader->Read(id, 32) != 32 || memreader->Seek(-32, SEEK_CUR) != 0)
		{
			delete memreader;
			return 0;
		}
		reader = memreader;
	}

	EMIDIType miditype = IdentifyMIDIType(id, sizeof(id));
	if (miditype != MIDI_NOTMIDI)
	{
		EMidiDevice devtype = device == NULL? MDEV_DEFAULT : (EMidiDevice)device->device;
#ifndef _WIN32
		// non-Windows platforms don't support MDEV_MMAPI so map to MDEV_SNDSYS
		if (devtype == MDEV_MMAPI)
			devtype = MDEV_SNDSYS;
#endif

retry_as_sndsys:
		info = CreateMIDIStreamer(*reader, devtype, miditype, device != NULL? device->args.GetChars() : "");
		if (info != NULL && !info->IsValid())
		{
			delete info;
			info = NULL;
		}
		if (info == NULL && devtype != MDEV_SNDSYS && snd_mididevice < 0)
		{
			devtype = MDEV_SNDSYS;
			goto retry_as_sndsys;
		}
#ifdef _WIN32
		if (info == NULL && devtype != MDEV_MMAPI && snd_mididevice >= 0)
		{
			info = CreateMIDIStreamer(*reader, MDEV_MMAPI, miditype, "");
		}
#endif
	}

	// Check for various raw OPL formats
	else if (
		(id[0] == MAKE_ID('R','A','W','A') && id[1] == MAKE_ID('D','A','T','A')) ||		// Rdos Raw OPL
		(id[0] == MAKE_ID('D','B','R','A') && id[1] == MAKE_ID('W','O','P','L')) ||		// DosBox Raw OPL
		(id[0] == MAKE_ID('A','D','L','I') && *((BYTE *)id + 4) == 'B'))		// Martin Fernandez's modified IMF
	{
		info = new OPLMUSSong (*reader, device != NULL? device->args.GetChars() : "");
	}
	// Check for game music
	else if ((fmt = GME_CheckFormat(id[0])) != NULL && fmt[0] != '\0')
	{
		info = GME_OpenSong(*reader, fmt);
	}
	// Check for module formats
	else
	{
		info = MOD_OpenSong(*reader);
	}

    if (info == NULL)
    {
        // Check for CDDA "format"
        if (id[0] == (('R')|(('I')<<8)|(('F')<<16)|(('F')<<24)))
        {
            DWORD subid;

            reader->Seek(8, SEEK_CUR);
            if (reader->Read (&subid, 4) != 4)
            {
                delete reader;
                return 0;
            }
            reader->Seek(-12, SEEK_CUR);

            if (subid == (('C')|(('D')<<8)|(('D')<<16)|(('A')<<24)))
            {
                // This is a CDDA file
                info = new CDDAFile (*reader);
            }
        }

        // no support in sound system => no modules/streams
        // 1024 bytes is an arbitrary restriction. It's assumed that anything
        // smaller than this can't possibly be a valid music file if it hasn't
        // been identified already, so don't even bother trying to load it.
        // Of course MIDIs shorter than 1024 bytes should pass.
        if (info == NULL && (reader->GetLength() >= 1024 || id[0] == MAKE_ID('M','T','h','d')))
        {
            // Let the sound system figure out what it is.
            info = new StreamSong (reader);
			// Assumed ownership
			reader = NULL;
        }
    }

	if (reader != NULL) delete reader;

	if (info && !info->IsValid ())
	{
		delete info;
		info = NULL;
	}

	return info;
}